

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_c.h
# Opt level: O3

void Quantities_init_am_matrices_(Quantities *quan,Dimensions dims,Env *env)

{
  Pointer *p;
  ulong uVar1;
  size_t __n;
  P *pPVar2;
  Bool_t BVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  size_t n;
  long lVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  long local_50;
  long local_48;
  
  uVar15 = (ulong)(uint)dims.nm;
  uVar8 = (ulong)(uint)dims.na;
  n = (size_t)(dims.nm * dims.na * 8);
  BVar3 = Env_cuda_is_using_device(env);
  Pointer_create(&quan->a_from_m,n,BVar3);
  p = &quan->m_from_a;
  BVar3 = Env_cuda_is_using_device(env);
  Pointer_create(p,n,BVar3);
  Pointer_allocate(&quan->a_from_m);
  Pointer_allocate(p);
  __n = uVar8 * 8;
  uVar17 = 0;
  iVar4 = 0;
  do {
    uVar19 = uVar15;
    uVar16 = uVar17;
    if (0 < dims.nm) {
      do {
        if (0 < dims.na) {
          if (quan == (Quantities *)0x0) goto LAB_00103dd6;
          pPVar2 = (quan->a_from_m).h_;
          if (pPVar2 == (P *)0x0) goto LAB_00103db7;
          memset(pPVar2 + uVar16,0,__n);
        }
        uVar16 = uVar16 + dims.na;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    iVar4 = iVar4 + 1;
    uVar17 = uVar17 + dims.na * 0x10;
  } while (iVar4 != 8);
  uVar17 = (dims.nm + -1) * dims.na;
  lVar13 = 0;
  lVar10 = 0;
  do {
    if (0 < dims.na) {
      if (quan == (Quantities *)0x0) {
LAB_00103dd6:
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer_kernels.h"
                      ,0x30,"P *restrict Pointer_h(Pointer *)");
      }
      pPVar2 = (quan->a_from_m).h_;
      if (pPVar2 == (P *)0x0) goto LAB_00103db7;
      if (dims.nm < 1) {
        __assert_fail("im >= 0 && im < dims.nm",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x156,
                      "P *ref_a_from_m(P *const restrict, const Dimensions, const int, const int, const int)"
                     );
      }
      uVar19 = 0;
      do {
        uVar11 = uVar19 + 1;
        pPVar2[uVar17 + uVar19] =
             (double)(int)((uVar11 & 0xffffffff) / (ulong)(uint)dims.nm) + pPVar2[uVar17 + uVar19];
        iVar4 = (int)((uVar11 & 0xffffffff) % (ulong)(uint)dims.nm);
        if (iVar4 != 0) {
          *(double *)((long)pPVar2 + uVar19 * 8 + lVar13) =
               *(double *)((long)pPVar2 + uVar19 * 8 + lVar13) + -1.0;
          uVar5 = (ulong)(uint)((iVar4 + (int)(lVar10 << 4)) * dims.na);
          pPVar2[uVar19 + uVar5] = pPVar2[uVar19 + uVar5] + 1.0;
        }
        uVar19 = uVar11;
      } while (uVar8 != uVar11);
    }
    lVar10 = lVar10 + 1;
    lVar13 = lVar13 + uVar8 * 0x80;
    uVar17 = uVar17 + dims.na * 0x10;
  } while (lVar10 != 8);
  local_50 = 2;
  local_48 = 1;
  lVar13 = 0;
  lVar10 = 0;
  do {
    if (2 < dims.nm) {
      uVar19 = 0;
      do {
        if (0 < dims.na) {
          if (quan == (Quantities *)0x0) goto LAB_00103dd6;
          pPVar2 = (quan->a_from_m).h_;
          if (pPVar2 == (P *)0x0) goto LAB_00103db7;
          lVar14 = (local_50 + uVar19) * __n;
          lVar20 = (local_48 + uVar19) * __n;
          lVar18 = (lVar13 + uVar19) * __n;
          iVar4 = (int)uVar19 + 0x15;
          uVar5 = 0;
          uVar11 = uVar19;
          do {
            dVar21 = (double)(iVar4 + (int)((uVar11 & 0xffffffff) / 0x11) * -0x11);
            *(double *)((long)pPVar2 + uVar5 * 8 + lVar18) =
                 *(double *)((long)pPVar2 + uVar5 * 8 + lVar18) - dVar21;
            *(double *)((long)pPVar2 + uVar5 * 8 + lVar20) =
                 dVar21 + dVar21 + *(double *)((long)pPVar2 + uVar5 * 8 + lVar20);
            *(double *)((long)pPVar2 + uVar5 * 8 + lVar14) =
                 *(double *)((long)pPVar2 + uVar5 * 8 + lVar14) - dVar21;
            uVar5 = uVar5 + 1;
            iVar4 = iVar4 + dims.nm;
            uVar11 = (ulong)(uint)((int)uVar11 + dims.nm);
          } while (uVar8 != uVar5);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != dims.nm - 2);
    }
    lVar10 = lVar10 + 1;
    local_50 = local_50 + 0x10;
    local_48 = local_48 + 0x10;
    lVar13 = lVar13 + 0x10;
  } while (lVar10 != 8);
  uVar19 = 0;
  lVar10 = 0;
  do {
    iVar4 = (int)uVar19;
    if (0 < dims.nm) {
      iVar9 = 0;
      do {
        iVar6 = (int)uVar19;
        if (0 < dims.na) {
          pPVar2 = (quan->m_from_a).h_;
          uVar11 = uVar8;
          if (pPVar2 == (P *)0x0) goto LAB_00103db7;
          do {
            pPVar2[uVar19] = 0.0;
            uVar19 = (ulong)((int)uVar19 + 0x10);
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar9 = iVar9 + 1;
        uVar19 = (ulong)(iVar6 + 1);
      } while (iVar9 != dims.nm);
    }
    lVar10 = lVar10 + 1;
    uVar19 = (ulong)(uint)(iVar4 + dims.na * 0x10);
  } while (lVar10 != 8);
  uVar17 = dims.na * 0x10 - 0x10;
  uVar19 = 0;
  lVar10 = 0;
  do {
    if (0 < dims.nm) {
      pPVar2 = (quan->m_from_a).h_;
      if (pPVar2 == (P *)0x0) {
LAB_00103db7:
        __assert_fail("p->h_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer_kernels.h"
                      ,0x31,"P *restrict Pointer_h(Pointer *)");
      }
      if (dims.na < 1) {
        __assert_fail("ia >= 0 && ia < dims.na",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x197,
                      "P *ref_m_from_a(P *const restrict, const Dimensions, const int, const int, const int)"
                     );
      }
      uVar5 = uVar19 >> 4 & 0xfffffff;
      uVar11 = 0;
      do {
        uVar1 = uVar11 + 1;
        pPVar2[uVar17 + uVar11] =
             (double)(int)((uVar1 & 0xffffffff) / (ulong)(uint)dims.na) + pPVar2[uVar17 + uVar11];
        iVar4 = (int)((uVar1 & 0xffffffff) % (ulong)(uint)dims.na);
        if (iVar4 != 0) {
          pPVar2[uVar5 * 0x10 + uVar11] = pPVar2[uVar5 * 0x10 + uVar11] + -1.0;
          uVar7 = (ulong)(uint)((iVar4 + (int)lVar10 * dims.na) * 0x10);
          pPVar2[uVar11 + uVar7] = pPVar2[uVar11 + uVar7] + 1.0;
        }
        uVar11 = uVar1;
      } while (uVar15 != uVar1);
    }
    lVar10 = lVar10 + 1;
    uVar19 = uVar19 + uVar8 * 0x10;
    uVar17 = uVar17 + dims.na * 0x10;
    if (lVar10 == 8) {
      uVar17 = 0x20;
      lVar10 = 0;
      do {
        if (0 < dims.nm) {
          iVar4 = 0x25;
          uVar19 = 0;
          do {
            if (2 < dims.na) {
              pPVar2 = (quan->m_from_a).h_;
              if (pPVar2 == (P *)0x0) goto LAB_00103db7;
              uVar5 = uVar19 & 0xffffffff;
              uVar11 = (ulong)(dims.na - 2);
              iVar9 = iVar4;
              uVar16 = uVar17;
              do {
                iVar6 = (int)(uVar5 * 0xaf286bcb >> 0x20);
                dVar21 = (double)(int)(iVar9 + (((uint)((int)uVar5 - iVar6) >> 1) + iVar6 >> 4) *
                                               -0x13);
                pPVar2[uVar19 + (uVar16 - 0x20)] = pPVar2[uVar19 + (uVar16 - 0x20)] - dVar21;
                pPVar2[uVar19 + (uVar16 - 0x10)] =
                     dVar21 + dVar21 + pPVar2[uVar19 + (uVar16 - 0x10)];
                pPVar2[uVar19 + uVar16] = pPVar2[uVar19 + uVar16] - dVar21;
                uVar16 = uVar16 + 0x10;
                iVar9 = iVar9 + dims.nm;
                uVar5 = (ulong)(uint)((int)uVar5 + dims.nm);
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
            uVar19 = uVar19 + 1;
            iVar4 = iVar4 + 1;
          } while (uVar19 != uVar15);
        }
        lVar10 = lVar10 + 1;
        uVar17 = uVar17 + dims.na * 0x10;
      } while (lVar10 != 8);
      uVar17 = 0;
      lVar10 = 0;
      do {
        if (0 < dims.nm) {
          iVar4 = 0;
          uVar16 = uVar17;
          do {
            if (0 < dims.na) {
              pPVar2 = (quan->m_from_a).h_;
              if (pPVar2 == (P *)0x0) goto LAB_00103db7;
              uVar15 = 0;
              uVar12 = uVar16;
              do {
                pPVar2[uVar12] = (pPVar2[uVar12] * 0.125) / (double)(1 << ((byte)uVar15 & 7));
                uVar15 = uVar15 + 1;
                uVar12 = uVar12 + 0x10;
              } while (uVar8 != uVar15);
            }
            iVar4 = iVar4 + 1;
            uVar16 = uVar16 + 1;
          } while (iVar4 != dims.nm);
        }
        lVar10 = lVar10 + 1;
        uVar17 = uVar17 + dims.na * 0x10;
        if (lVar10 == 8) {
          Pointer_update_d(&quan->a_from_m);
          Pointer_update_d(p);
          return;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void Quantities_init_am_matrices_( Quantities*       quan,
                                   const Dimensions  dims,
                                   Env*              env )
{
  /*---Declarations---*/

  int im     = 0;
  int ia     = 0;
  int i      = 0;
  int octant = 0;

  /*---Allocate arrays---*/

  Pointer_create( & quan->a_from_m, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );
  Pointer_create( & quan->m_from_a, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );

  Pointer_allocate( & quan->a_from_m );
  Pointer_allocate( & quan->m_from_a );

  /*-----------------------------*/
  /*---Set entries of a_from_m---*/
  /*-----------------------------*/

  /*---These two matrices are set in a special way so as to map a vector
       whose values satisfy a linear relationship v_i = a * i + b
       are mapped to another vector with same property.  This is to facilitate
       being able to have an analytical solution for the sweep.
  ---*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im, ia, octant )
                                                                   = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---The input state vector in the moment dimension is contrived to
       satisfy vi[im] = 1 + im, an affine function, possibly times a constant.
       The following matrix is artifically contrived to send this to
       a result satisfying, in angle, vl[ia] = 1 + ia, possibly times a
       constant.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.na;      ++i )
  {
    const int quot = ( i + 1 ) / dims.nm;
    const int rem  = ( i + 1 ) % dims.nm;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, dims.nm-1, i, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, 0,   i, octant )
                                                                   += -P_one();
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, rem, i, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---This is to create a more dense, nontrivial matrix, with additions
       to the rows that are guaranteed to send affine functions to zero.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm-2;   ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    const int randvalue = 21 + ( im + dims.nm * ia ) % 17;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+0, ia, octant ) +=
                                                          -P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+1, ia, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+2, ia, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*-----------------------------*/
  /*---Set entries of m_from_a---*/
  /*-----------------------------*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---As previously, send functions vl[ia] = 1 + ia to functions
       vo[im] = 1 + im, subject to possible constant scalings
       and also to a power-of-two angle scalefactor adjustment
       designed to make the test more rigorous.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.nm;      ++i )
  {
    const int quot = ( i + 1 ) / dims.na;
    const int rem  = ( i + 1 ) % dims.na;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, dims.na-1, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, 0  , octant )
                                                                   += -P_one();
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, rem, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---As before, create more complicated matrix by adding to rows
       entries that do not affect the scaled-affine input values expected.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na-2;   ++ia )
  {
    const int randvalue = 37 + ( im + dims.nm * ia ) % 19;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+0, octant ) +=
                                                          -P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+1, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+2, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*---Scale matrix to compensate for 8 octants and also angle scale factor---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    /= NOCTANT;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                 /= Quantities_scalefactor_angle_( dims, ia );
  }

  Pointer_update_d( & quan->a_from_m );
  Pointer_update_d( & quan->m_from_a );

}